

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgDisplay * __thiscall cimg_library::CImgDisplay::paint(CImgDisplay *this,bool wait_expose)

{
  Display *pDVar1;
  X11_info *pXVar2;
  
  if ((this->_width != 0) && (this->_height != 0)) {
    pXVar2 = cimg::X11_attr();
    pDVar1 = pXVar2->display;
    XLockDisplay(pDVar1);
    _paint(this,wait_expose);
    XUnlockDisplay(pDVar1);
  }
  return this;
}

Assistant:

CImgDisplay& paint(const bool wait_expose=true) {
      if (is_empty()) return *this;
      Display *const dpy = cimg::X11_attr().display;
      XLockDisplay(dpy);
      _paint(wait_expose);
      XUnlockDisplay(dpy);
      return *this;
    }